

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseEnumConstantOptions
          (Parser *this,EnumValueDescriptorProto *value,LocationRecorder *enum_value_location,
          FileDescriptorProto *containing_file)

{
  bool bVar1;
  bool bVar2;
  EnumValueOptions *options;
  string_view text;
  string_view text_00;
  string_view text_01;
  string_view text_02;
  LocationRecorder location;
  
  text._M_str = "[";
  text._M_len = 1;
  bVar1 = LookingAt(this,text);
  bVar2 = true;
  if (bVar1) {
    LocationRecorder::LocationRecorder(&location,enum_value_location,3);
    text_00._M_str = "[";
    text_00._M_len = 1;
    bVar1 = Consume(this,text_00);
    if (bVar1) {
      do {
        options = EnumValueDescriptorProto::mutable_options(value);
        bVar1 = ParseOption(this,&options->super_Message,&location,containing_file,OPTION_ASSIGNMENT
                           );
        if (!bVar1) goto LAB_00be44fd;
        text_01._M_str = ",";
        text_01._M_len = 1;
        bVar1 = TryConsume(this,text_01);
      } while (bVar1);
      text_02._M_str = "]";
      text_02._M_len = 1;
      bVar2 = Consume(this,text_02);
    }
    else {
LAB_00be44fd:
      bVar2 = false;
    }
    LocationRecorder::~LocationRecorder(&location);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseEnumConstantOptions(
    EnumValueDescriptorProto* value,
    const LocationRecorder& enum_value_location,
    const FileDescriptorProto* containing_file) {
  if (!LookingAt("[")) return true;

  LocationRecorder location(enum_value_location,
                            EnumValueDescriptorProto::kOptionsFieldNumber);

  DO(Consume("["));

  do {
    DO(ParseOption(value->mutable_options(), location, containing_file,
                   OPTION_ASSIGNMENT));
  } while (TryConsume(","));

  DO(Consume("]"));
  return true;
}